

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

Expr __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
::ReadSymbolicExpr(NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
                   *this)

{
  StringRef value;
  char cVar1;
  Expr else_expr_00;
  int iVar2;
  int iVar3;
  Expr condition_00;
  Expr then_expr_00;
  undefined8 *in_RDI;
  TextReader<fmt::Locale> *in_stack_00000020;
  Expr else_expr;
  Expr then_expr;
  LogicalExpr condition;
  int opcode;
  char c;
  int in_stack_00000084;
  NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
  *in_stack_00000088;
  NLHandler<mp::NullNLHandler<BasicTestExpr<0>_>,_BasicTestExpr<0>_> *this_00;
  undefined4 uVar4;
  Kind kind;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd4;
  undefined2 uVar5;
  NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
  *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  uVar5 = (undefined2)((uint)in_stack_ffffffffffffffd4 >> 0x10);
  uVar4 = SUB84(in_RDI,0);
  kind = (Kind)((ulong)in_RDI >> 0x20);
  cVar1 = ReaderBase::ReadChar((ReaderBase *)*in_RDI);
  else_expr_00.id_ = (IDType)cVar1;
  if (else_expr_00.id_ == 0x68) {
    this_00 = *(NLHandler<mp::NullNLHandler<BasicTestExpr<0>_>,_BasicTestExpr<0>_> **)
               (CONCAT44(kind,uVar4) + 0x10);
    TextReader<fmt::Locale>::ReadString(in_stack_00000020);
    value.data_._4_4_ = kind;
    value.data_._0_4_ = uVar4;
    value.size_._0_4_ = else_expr_00.id_;
    value.size_._4_4_ = in_stack_ffffffffffffffbc;
    local_4 = (IDType)NLHandler<mp::NullNLHandler<BasicTestExpr<0>_>,_BasicTestExpr<0>_>::OnString
                                (this_00,value);
  }
  else if (else_expr_00.id_ == 0x6f) {
    iVar2 = ReadOpCode((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
                        *)CONCAT44(kind,uVar4));
    iVar3 = mp::expr::nl_opcode(kind);
    if (iVar2 == iVar3) {
      ReadLogicalExpr((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
                       *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      condition_00 = ReadSymbolicExpr((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
                                       *)CONCAT17(cVar1,in_stack_ffffffffffffffe8));
      then_expr_00 = ReadSymbolicExpr((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
                                       *)CONCAT17(cVar1,in_stack_ffffffffffffffe8));
      local_4 = (IDType)NLHandler<mp::NullNLHandler<BasicTestExpr<0>_>,_BasicTestExpr<0>_>::
                        OnSymbolicIf((NLHandler<mp::NullNLHandler<BasicTestExpr<0>_>,_BasicTestExpr<0>_>
                                      *)CONCAT44(kind,uVar4),condition_00.id_,then_expr_00.id_,
                                     else_expr_00);
    }
    else {
      local_4 = ReadNumericExpr(in_stack_00000088,in_stack_00000084);
    }
  }
  else {
    local_4 = ReadNumericExpr(in_stack_ffffffffffffffd8,(char)((ushort)uVar5 >> 8),SUB21(uVar5,0));
  }
  return (Expr)local_4;
}

Assistant:

typename Handler::Expr NLReader<Reader, Handler>::ReadSymbolicExpr() {
  char c = reader_.ReadChar();
  switch (c) {
  case 'h':
    return handler_.OnString(reader_.ReadString());
  case 'o': {
    int opcode = ReadOpCode();
    if (opcode != expr::nl_opcode(expr::IFSYM))
      return ReadNumericExpr(opcode);
    // Read symbolic if expression.
    LogicalExpr condition = ReadLogicalExpr();
    Expr then_expr = ReadSymbolicExpr();
    Expr else_expr = ReadSymbolicExpr();
    return handler_.OnSymbolicIf(condition, then_expr, else_expr);
  }
  }
  return ReadNumericExpr(c, false);
}